

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Addition.h
# Opt level: O0

ptr<Value> __thiscall Addition::asStrings(Addition *this,string *leftOperand,string *rightOperand)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [24];
  string *rightOperand_local;
  string *leftOperand_local;
  Addition *this_local;
  
  rightOperand_local = rightOperand;
  leftOperand_local = leftOperand;
  this_local = this;
  std::operator+(&local_58,rightOperand,in_RCX);
  make<String,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::shared_ptr<Value>::shared_ptr<String,void>
            ((shared_ptr<Value> *)this,(shared_ptr<String> *)local_38);
  std::shared_ptr<String>::~shared_ptr((shared_ptr<String> *)local_38);
  std::__cxx11::string::~string((string *)&local_58);
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> asStrings(const std::string &leftOperand, const std::string &rightOperand) override {
        return make<String>(leftOperand + rightOperand);
    }